

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_stream_stop(cubeb_stream_conflict *stm)

{
  pa_threaded_mainloop *ppVar1;
  cubeb_log_level cVar2;
  cubeb_log_callback p_Var3;
  
  (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
  stm->shutdown = 1;
  while (ppVar1 = stm->context->mainloop, stm->drain_timer != (pa_time_event *)0x0) {
    (*cubeb_pa_threaded_mainloop_wait)(ppVar1);
  }
  (*cubeb_pa_threaded_mainloop_unlock)(ppVar1);
  stream_cork(stm,NOTIFY|CORK);
  cVar2 = cubeb_log_get_level();
  if (cVar2 != CUBEB_LOG_DISABLED) {
    p_Var3 = cubeb_log_get_callback();
    if (p_Var3 != (cubeb_log_callback)0x0) {
      cubeb_log_internal("cubeb_pulse.c",0x46b,"Cubeb stream (%p) stopped successfully.",stm);
    }
  }
  return 0;
}

Assistant:

static int
pulse_stream_stop(cubeb_stream * stm)
{
  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  stm->shutdown = 1;
  // If draining is taking place wait to finish
  while (stm->drain_timer) {
    WRAP(pa_threaded_mainloop_wait)(stm->context->mainloop);
  }
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  stream_cork(stm, CORK | NOTIFY);
  LOG("Cubeb stream (%p) stopped successfully.", stm);
  return CUBEB_OK;
}